

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.h
# Opt level: O2

size_t duckdb_fsst_decompress
                 (duckdb_fsst_decoder_t *decoder,size_t lenIn,uchar *strIn,size_t size,uchar *output
                 )

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  
  sVar4 = 0;
  uVar8 = 0;
  while( true ) {
    if ((lenIn < uVar8 + 4) || (size < sVar4 + 0x20)) break;
    uVar3 = *(uint *)(strIn + uVar8);
    uVar7 = ~((~uVar3 & 0x7f7f7f7f) + 0x7f7f7f7f) & uVar3 & 0x80808080;
    if (uVar7 != 0) {
      uVar3 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      sVar4 = (*(code *)(&DAT_01fe2d8c + *(int *)(&DAT_01fe2d8c + (ulong)(uVar3 >> 3) * 4)))();
      return sVar4;
    }
    *(unsigned_long_long *)(output + sVar4) = decoder->symbol[uVar3 & 0xff];
    lVar10 = decoder->len[uVar3 & 0xff] + sVar4;
    bVar2 = strIn[uVar8 + 1];
    *(unsigned_long_long *)(output + lVar10) = decoder->symbol[bVar2];
    lVar10 = (ulong)decoder->len[bVar2] + lVar10;
    bVar2 = strIn[uVar8 + 2];
    *(unsigned_long_long *)(output + lVar10) = decoder->symbol[bVar2];
    lVar10 = (ulong)decoder->len[bVar2] + lVar10;
    bVar2 = strIn[uVar8 + 3];
    *(unsigned_long_long *)(output + lVar10) = decoder->symbol[bVar2];
    sVar4 = (ulong)decoder->len[bVar2] + lVar10;
    uVar8 = uVar8 + 4;
  }
  if (sVar4 + 0x20 <= size) {
    uVar1 = uVar8 + 2;
    if (uVar1 <= lenIn) {
      output[sVar4] = strIn[uVar8 + 1];
      uVar5 = (ulong)strIn[uVar8];
      if (uVar5 == 0xff) {
        sVar4 = sVar4 + 1;
        uVar8 = uVar1;
      }
      else {
        *(unsigned_long_long *)(output + sVar4) = decoder->symbol[uVar5];
        lVar10 = decoder->len[uVar5] + sVar4;
        uVar5 = (ulong)strIn[uVar8 + 1];
        if (uVar5 == 0xff) {
          output[lVar10] = strIn[uVar8 + 2];
          sVar4 = lVar10 + 1;
          uVar8 = uVar8 + 3;
        }
        else {
          *(unsigned_long_long *)(output + lVar10) = decoder->symbol[uVar5];
          sVar4 = (ulong)decoder->len[uVar5] + lVar10;
          uVar8 = uVar1;
        }
      }
    }
    if (uVar8 < lenIn) {
      bVar2 = strIn[uVar8];
      uVar8 = uVar8 + 1;
      *(unsigned_long_long *)(output + sVar4) = decoder->symbol[bVar2];
      sVar4 = sVar4 + decoder->len[bVar2];
    }
  }
  while (sVar6 = sVar4, uVar8 < lenIn) {
    uVar1 = uVar8 + 1;
    uVar5 = (ulong)strIn[uVar8];
    if (uVar5 == 0xff) {
      if (sVar6 < size) {
        output[sVar6] = strIn[uVar1];
      }
      sVar4 = sVar6 + 1;
      uVar8 = uVar8 + 2;
    }
    else {
      sVar4 = decoder->len[uVar5] + sVar6;
      sVar11 = size;
      if (sVar4 < size) {
        sVar11 = sVar4;
      }
      lVar10 = sVar11 - sVar6;
      if (sVar11 < sVar6) {
        lVar10 = 0;
      }
      for (lVar9 = 0; uVar8 = uVar1, lVar10 != lVar9; lVar9 = lVar9 + 1) {
        output[lVar9 + sVar6] = *(uchar *)((long)decoder->symbol + lVar9 + uVar5 * 8);
      }
    }
  }
  if ((size <= sVar6) && ((decoder->zeroTerminated & 1) != 0)) {
    output[size - 1] = '\0';
  }
  return sVar6;
}

Assistant:

inline size_t /* OUT: bytesize of the decompressed string. If > size, the decoded output is truncated to size. */
duckdb_fsst_decompress(
   duckdb_fsst_decoder_t *decoder,  /* IN: use this symbol table for compression. */
   size_t lenIn,             /* IN: byte-length of compressed string. */
   const unsigned char *strIn,     /* IN: compressed string. */
   size_t size,              /* IN: byte-length of output buffer. */
   unsigned char *output     /* OUT: memory buffer to put the decompressed string in. */
) {
   unsigned char*__restrict__ len = (unsigned char* __restrict__) decoder->len;
   unsigned char*__restrict__ strOut = (unsigned char* __restrict__) output;
   unsigned long long*__restrict__ symbol = (unsigned long long* __restrict__) decoder->symbol; 
   size_t code, posOut = 0, posIn = 0;
#ifndef FSST_MUST_ALIGN /* defining on platforms that require aligned memory access may help their performance */
#define FSST_UNALIGNED_STORE(dst,src) memcpy((void*) (dst), &(src), sizeof(unsigned long long))
#if defined(__BYTE_ORDER__) && defined(__ORDER_LITTLE_ENDIAN__) && (__BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__)
   while (posOut+32 <= size && posIn+4 <= lenIn) {
      unsigned int nextBlock, escapeMask;
      memcpy(&nextBlock, strIn+posIn, sizeof(unsigned int));
      escapeMask = (nextBlock&0x80808080u)&((((~nextBlock)&0x7F7F7F7Fu)+0x7F7F7F7Fu)^0x80808080u);
      if (escapeMask == 0) {
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
     } else { 
         unsigned long firstEscapePos=static_cast<unsigned long>(__builtin_ctzll((unsigned long long) escapeMask)>>3);
         switch(firstEscapePos) { /* Duff's device */
         case 3: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 2: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 1: code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
			 DUCKDB_FSST_EXPLICIT_FALLTHROUGH;
         case 0: posIn+=2; strOut[posOut++] = strIn[posIn-1]; /* decompress an escaped byte */
         }
      }
   }
   if (posOut+32 <= size) { // handle the possibly 3 last bytes without a loop
      if (posIn+2 <= lenIn) { 
	 strOut[posOut] = strIn[posIn+1]; 
         if (strIn[posIn] != FSST_ESC) {
            code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
            if (strIn[posIn] != FSST_ESC) {
               code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code]; 
            } else { 
               posIn += 2; strOut[posOut++] = strIn[posIn-1]; 
            }
         } else {
            posIn += 2; posOut++; 
         } 
      }
      if (posIn < lenIn) { // last code cannot be an escape
         code = strIn[posIn++]; FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); posOut += len[code];
      }
   }
#else
   while (posOut+8 <= size && posIn < lenIn)
      if ((code = strIn[posIn++]) < FSST_ESC) { /* symbol compressed as code? */
         FSST_UNALIGNED_STORE(strOut+posOut, symbol[code]); /* unaligned memory write */
         posOut += len[code];
      } else { 
         strOut[posOut] = strIn[posIn]; /* decompress an escaped byte */
         posIn++; posOut++; 
      }
#endif
#endif
   while (posIn < lenIn)
      if ((code = strIn[posIn++]) < FSST_ESC) {
         size_t posWrite = posOut, endWrite = posOut + len[code];
         unsigned char* __restrict__ symbolPointer = ((unsigned char* __restrict__) &symbol[code]) - posWrite;
         if ((posOut = endWrite) > size) endWrite = size;
         for(; posWrite < endWrite; posWrite++)  /* only write if there is room */
            strOut[posWrite] = symbolPointer[posWrite];
      } else {
         if (posOut < size) strOut[posOut] = strIn[posIn]; /* idem */
         posIn++; posOut++; 
      } 
   if (posOut >= size && (decoder->zeroTerminated&1)) strOut[size-1] = 0;
   return posOut; /* full size of decompressed string (could be >size, then the actually decompressed part) */
}